

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

GenFuncs<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
* deqp::gls::BuiltinPrecisionTests::
  makeVectorizedFuncs<deqp::gls::BuiltinPrecisionTests::Functions::LdExp>(void)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pFVar1;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
  *pGVar2;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
  *pGVar3;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_4>
  *pGVar4;
  GenFuncs<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *in_RDI;
  
  pFVar1 = (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)instance<deqp::gls::BuiltinPrecisionTests::Functions::LdExp>();
  pGVar2 = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::LdExp,2>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
  ;
  pGVar3 = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::LdExp,3>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
  ;
  pGVar4 = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::LdExp,4>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_4>
  ;
  in_RDI->func = pFVar1;
  in_RDI->func2 = pGVar2;
  in_RDI->func3 = pGVar3;
  in_RDI->func4 = pGVar4;
  return in_RDI;
}

Assistant:

GenFuncs<typename F::Sig> makeVectorizedFuncs (void)
{
	return GenFuncs<typename F::Sig>(instance<F>(),
									 instance<VectorizedFunc<F, 2> >(),
									 instance<VectorizedFunc<F, 3> >(),
									 instance<VectorizedFunc<F, 4> >());
}